

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.cpp
# Opt level: O0

bool Imath_2_5::anon_unknown_9::normalizeOrThrow<short>(Vec4<short> *v)

{
  short sVar1;
  short *psVar2;
  undefined8 uVar3;
  Vec4<short> *in_RDI;
  int i;
  int axis;
  char *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  int local_10;
  int local_c;
  
  local_c = -1;
  local_10 = 0;
  do {
    if (3 < local_10) {
      psVar2 = Vec4<short>::operator[](in_RDI,local_c);
      sVar1 = -1;
      if (0 < *psVar2) {
        sVar1 = 1;
      }
      psVar2 = Vec4<short>::operator[](in_RDI,local_c);
      *psVar2 = sVar1;
      return true;
    }
    psVar2 = Vec4<short>::operator[](in_RDI,local_10);
    if (*psVar2 != 0) {
      if (local_c != -1) {
        uVar3 = __cxa_allocate_exception(0x48);
        IntVecNormalizeExc::IntVecNormalizeExc
                  ((IntVecNormalizeExc *)
                   CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
        __cxa_throw(uVar3,&IntVecNormalizeExc::typeinfo,IntVecNormalizeExc::~IntVecNormalizeExc);
      }
      local_c = local_10;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

bool
normalizeOrThrow(Vec4<T> &v)
{
    int axis = -1;
    for (int i = 0; i < 4; i ++)
    {
        if (v[i] != 0)
        {
            if (axis != -1)
            {
                throw IntVecNormalizeExc ("Cannot normalize an integer "
                                          "vector unless it is parallel "
                                          "to a principal axis");
            }
            axis = i;
        }
    }
    v[axis] = (v[axis] > 0) ? 1 : -1;
    return true;
}